

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall
llbuild::core::TaskInterface::spawn
          (TaskInterface *this,QueueJobContext *context,ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  long *plVar1;
  code *pcVar2;
  undefined8 local_88;
  undefined8 uStack_80;
  code *local_78;
  undefined8 uStack_70;
  char local_68;
  ProcessAttributes local_58;
  
  plVar1 = *(long **)((long)this->impl + 0xb8);
  local_58.workingDir.Length._0_4_ = (undefined4)attributes.workingDir.Length;
  local_58.workingDir.Length._4_4_ = attributes.workingDir.Length._4_4_;
  local_58.inheritEnvironment = attributes.inheritEnvironment;
  local_58.controlEnabled = attributes.controlEnabled;
  local_58._26_2_ = attributes._26_2_;
  local_58._28_4_ = attributes._28_4_;
  local_58.canSafelyInterrupt = attributes.canSafelyInterrupt;
  local_58.connectToConsole = attributes.connectToConsole;
  local_58._2_6_ = attributes._2_6_;
  local_58.workingDir.Data = attributes.workingDir.Data;
  local_68 = (completionFn->Storage).hasVal;
  if ((bool)local_68 == true) {
    local_78 = (code *)0x0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    pcVar2 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                       0x10);
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)(&local_88,completionFn,2);
      local_78 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer
                           + 0x10);
      uStack_70 = *(undefined8 *)
                   ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18)
      ;
    }
  }
  (**(code **)(*plVar1 + 0x20))
            (plVar1,context,commandLine.Data,commandLine.Length,environment.Data,environment.Length,
             local_58._0_4_,local_58.workingDir.Data._0_4_,(undefined4)local_58.workingDir.Length,
             local_58._24_4_,&local_88,delegate);
  if ((local_68 == '\x01') && (local_78 != (code *)0x0)) {
    (*local_78)(&local_88,&local_88,3);
  }
  return;
}

Assistant:

void TaskInterface::spawn(basic::QueueJobContext *context,
                          ArrayRef<StringRef> commandLine,
                          ArrayRef<std::pair<StringRef, StringRef> > environment,
                          basic::ProcessAttributes attributes,
                          llvm::Optional<basic::ProcessCompletionFn> completionFn,
                          basic::ProcessDelegate* delegate) {
  static_cast<BuildEngineImpl*>(impl)->getExecutionQueue().executeProcess(
    context, commandLine, environment, attributes, completionFn, delegate);
}